

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O2

BOOL __thiscall LASquadtree::manage_cell(LASquadtree *this,U32 cell_index,BOOL finalize)

{
  U32 level;
  U32 level_index;
  U32 UVar1;
  U32 *ptr;
  ulong uVar2;
  U32 i;
  uint uVar3;
  uint uVar4;
  
  uVar3 = cell_index >> 5;
  uVar2 = (ulong)this->adaptive_alloc;
  ptr = this->adaptive;
  if (this->adaptive_alloc <= uVar3) {
    if (ptr == (U32 *)0x0) {
      uVar4 = uVar3 + 1;
      ptr = (U32 *)malloc((ulong)(uVar3 * 4 + 4));
      this->adaptive = ptr;
      for (; uVar2 <= uVar3; uVar2 = uVar2 + 1) {
        ptr[uVar2] = 0;
      }
    }
    else {
      uVar4 = uVar3 * 2;
      ptr = (U32 *)realloc_las(ptr,(ulong)(uVar3 << 3));
      this->adaptive = ptr;
      for (uVar2 = (ulong)this->adaptive_alloc; uVar2 < uVar4; uVar2 = uVar2 + 1) {
        ptr[uVar2] = 0;
      }
    }
    this->adaptive_alloc = uVar4;
  }
  ptr[uVar3] = ptr[uVar3] & ~(1 << ((byte)cell_index & 0x1f));
  level = get_level(this,cell_index);
  level_index = get_level_index(this,cell_index,level);
  while( true ) {
    level = level - 1;
    if (level == 0xffffffff) {
      return true;
    }
    level_index = level_index >> 2;
    UVar1 = get_cell_index(this,level_index,level);
    if ((ptr[UVar1 >> 5] >> (UVar1 & 0x1f) & 1) != 0) break;
    ptr[UVar1 >> 5] = 1 << ((byte)UVar1 & 0x1f) | ptr[UVar1 >> 5];
  }
  return true;
}

Assistant:

BOOL LASquadtree::manage_cell(const U32 cell_index, const BOOL finalize)
{
  U32 adaptive_pos = cell_index/32;
  U32 adaptive_bit = ((U32)1) << (cell_index%32);
  if (adaptive_pos >= adaptive_alloc)
  {
    if (adaptive)
    {
      adaptive = (U32*)realloc_las(adaptive, adaptive_pos*2*sizeof(U32));
      for (U32 i = adaptive_alloc; i < adaptive_pos*2; i++) adaptive[i] = 0;
      adaptive_alloc = adaptive_pos*2;
    }
    else
    {
#pragma warning(push)
#pragma warning(disable : 6011)
      adaptive = (U32*)malloc((adaptive_pos+1)*sizeof(U32));
      for (U32 i = adaptive_alloc; i <= adaptive_pos; i++) adaptive[i] = 0;
      adaptive_alloc = adaptive_pos+1;
#pragma warning(pop)
    }
  }
  adaptive[adaptive_pos] &= ~adaptive_bit;
  U32 index;
  U32 level = get_level(cell_index);
  U32 level_index = get_level_index(cell_index, level);
  while (level)
  {
    level--;
    level_index = level_index >> 2;
    index = get_cell_index(level_index, level);
    adaptive_pos = index/32;
    adaptive_bit = ((U32)1) << (index%32);
    if (adaptive[adaptive_pos] & adaptive_bit) break;
    adaptive[adaptive_pos] |= adaptive_bit;
  }
  return TRUE;
}